

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_decoder.cc
# Opt level: O3

PointAttribute * __thiscall
draco::PointCloudDecoder::GetPortableAttribute(PointCloudDecoder *this,int32_t parent_att_id)

{
  PointAttribute *pPVar1;
  
  if ((-1 < parent_att_id) &&
     (parent_att_id <
      (int)((ulong)((long)(this->point_cloud_->attributes_).
                          super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->point_cloud_->attributes_).
                         super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3))) {
    pPVar1 = (PointAttribute *)
             (**(code **)(*(long *)(this->attributes_decoders_).
                                   super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start
                                   [(this->attribute_to_decoder_map_).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[(uint)parent_att_id]]._M_t.
                                   super___uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
                                   ._M_t + 0x40))();
    return pPVar1;
  }
  return (PointAttribute *)0x0;
}

Assistant:

const PointAttribute *PointCloudDecoder::GetPortableAttribute(
    int32_t parent_att_id) {
  if (parent_att_id < 0 || parent_att_id >= point_cloud_->num_attributes()) {
    return nullptr;
  }
  const int32_t parent_att_decoder_id =
      attribute_to_decoder_map_[parent_att_id];
  return attributes_decoders_[parent_att_decoder_id]->GetPortableAttribute(
      parent_att_id);
}